

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

void Lf_ManSetFlowRefs(Gia_Man_t *p,Vec_Flt_t *vRefs,Vec_Int_t *vOffsets)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *pVVar2;
  Vec_Flt_t *p_00;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_4c;
  int Id;
  int i;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *pCtrl;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVStack_20;
  int fDiscount;
  Vec_Int_t *vOffsets_local;
  Vec_Flt_t *vRefs_local;
  Gia_Man_t *p_local;
  
  pObj._4_4_ = 1;
  pVStack_20 = vOffsets;
  vOffsets_local = (Vec_Int_t *)vRefs;
  vRefs_local = (Vec_Flt_t *)p;
  iVar3 = Gia_ManAndNotBufNum(p);
  Vec_FltFill(vRefs,iVar3,0.0);
  local_4c = 0;
  while( true ) {
    bVar6 = false;
    if (local_4c < *(int *)&vRefs_local[1].pArray) {
      pCtrl = Gia_ManObj((Gia_Man_t *)vRefs_local,local_4c);
      bVar6 = pCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar3 = Gia_ObjIsAnd(pCtrl);
    if (iVar3 != 0) {
      pGVar5 = Gia_ObjFanin0(pCtrl);
      iVar3 = Gia_ObjIsAndNotBuf(pGVar5);
      pVVar2 = vOffsets_local;
      pVVar1 = pVStack_20;
      if (iVar3 != 0) {
        iVar3 = Gia_ObjFaninId0(pCtrl,local_4c);
        iVar3 = Vec_IntEntry(pVVar1,iVar3);
        Vec_FltAddToEntry((Vec_Flt_t *)pVVar2,iVar3,1.0);
      }
      iVar3 = Gia_ObjIsBuf(pCtrl);
      if (iVar3 == 0) {
        pGVar5 = Gia_ObjFanin1(pCtrl);
        iVar3 = Gia_ObjIsAndNotBuf(pGVar5);
        pVVar2 = vOffsets_local;
        pVVar1 = pVStack_20;
        if (iVar3 != 0) {
          iVar3 = Gia_ObjFaninId1(pCtrl,local_4c);
          iVar3 = Vec_IntEntry(pVVar1,iVar3);
          Vec_FltAddToEntry((Vec_Flt_t *)pVVar2,iVar3,1.0);
        }
        if (vRefs_local[2].pArray == (float *)0x0) {
          if ((pObj._4_4_ != 0) && (iVar3 = Gia_ObjIsMuxType(pCtrl), iVar3 != 0)) {
            pGVar5 = Gia_ObjRecognizeMux(pCtrl,(Gia_Obj_t **)&Id,&pData1);
            pData0 = Gia_Regular(pGVar5);
            pData1 = Gia_Regular(pData1);
            _Id = Gia_Regular(_Id);
            iVar3 = Gia_ObjIsAndNotBuf(pData0);
            pVVar2 = vOffsets_local;
            pVVar1 = pVStack_20;
            if (iVar3 != 0) {
              iVar3 = Gia_ObjId((Gia_Man_t *)vRefs_local,pData0);
              iVar3 = Vec_IntEntry(pVVar1,iVar3);
              Vec_FltAddToEntry((Vec_Flt_t *)pVVar2,iVar3,-1.0);
            }
            if ((pData1 == _Id) &&
               (iVar3 = Gia_ObjIsAndNotBuf(pData1), pVVar2 = vOffsets_local, pVVar1 = pVStack_20,
               iVar3 != 0)) {
              iVar3 = Gia_ObjId((Gia_Man_t *)vRefs_local,pData1);
              iVar3 = Vec_IntEntry(pVVar1,iVar3);
              Vec_FltAddToEntry((Vec_Flt_t *)pVVar2,iVar3,-1.0);
            }
          }
        }
        else {
          iVar3 = Gia_ObjIsMuxId((Gia_Man_t *)vRefs_local,local_4c);
          if (iVar3 != 0) {
            pGVar5 = Gia_ObjFanin2((Gia_Man_t *)vRefs_local,pCtrl);
            iVar3 = Gia_ObjIsAndNotBuf(pGVar5);
            pVVar2 = vOffsets_local;
            pVVar1 = pVStack_20;
            if (iVar3 != 0) {
              iVar3 = Gia_ObjFaninId2((Gia_Man_t *)vRefs_local,local_4c);
              iVar3 = Vec_IntEntry(pVVar1,iVar3);
              Vec_FltAddToEntry((Vec_Flt_t *)pVVar2,iVar3,1.0);
            }
          }
        }
      }
    }
    local_4c = local_4c + 1;
  }
  for (local_4c = 0; iVar3 = Vec_IntSize((Vec_Int_t *)vRefs_local[4].pArray), p_00 = vRefs_local,
      local_4c < iVar3; local_4c = local_4c + 1) {
    pGVar5 = Gia_ManCo((Gia_Man_t *)vRefs_local,local_4c);
    iVar3 = Gia_ObjFaninId0p((Gia_Man_t *)p_00,pGVar5);
    pGVar5 = Gia_ManObj((Gia_Man_t *)vRefs_local,iVar3);
    iVar4 = Gia_ObjIsAndNotBuf(pGVar5);
    pVVar1 = vOffsets_local;
    if (iVar4 != 0) {
      iVar3 = Vec_IntEntry(pVStack_20,iVar3);
      Vec_FltAddToEntry((Vec_Flt_t *)pVVar1,iVar3,1.0);
    }
  }
  for (local_4c = 0; iVar3 = Vec_FltSize((Vec_Flt_t *)vOffsets_local), local_4c < iVar3;
      local_4c = local_4c + 1) {
    Vec_FltUpdateEntry((Vec_Flt_t *)vOffsets_local,local_4c,1.0);
  }
  return;
}

Assistant:

void Lf_ManSetFlowRefs( Gia_Man_t * p, Vec_Flt_t * vRefs, Vec_Int_t * vOffsets )
{
    int fDiscount = 1;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; 
    int i, Id;
    Vec_FltFill( vRefs, Gia_ManAndNotBufNum(p), 0 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin0(pObj)) )
            Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjFaninId0(pObj, i)), 1 );
        if ( Gia_ObjIsBuf(pObj) )
            continue;
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin1(pObj)) )
            Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjFaninId1(pObj, i)), 1 );
        if ( p->pMuxes )
        {
            if ( Gia_ObjIsMuxId(p, i) && Gia_ObjIsAndNotBuf(Gia_ObjFanin2(p, pObj)) )
                Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjFaninId2(p, i)), 1 );
        }
        else if ( fDiscount && Gia_ObjIsMuxType(pObj) ) // discount XOR/MUX
        {
            pCtrl  = Gia_Regular(Gia_ObjRecognizeMux(pObj, &pData1, &pData0));
            pData0 = Gia_Regular(pData0);
            pData1 = Gia_Regular(pData1);
            if ( Gia_ObjIsAndNotBuf(pCtrl) )
                Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjId(p, pCtrl)), -1 );
            if ( pData0 == pData1 && Gia_ObjIsAndNotBuf(pData0) )
                Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Gia_ObjId(p, pData0)), -1 );
        }
    }
    Gia_ManForEachCoDriverId( p, Id, i )
        if ( Gia_ObjIsAndNotBuf(Gia_ManObj(p, Id)) )
            Vec_FltAddToEntry( vRefs, Vec_IntEntry(vOffsets, Id), 1 );
    for ( i = 0; i < Vec_FltSize(vRefs); i++ )
        Vec_FltUpdateEntry( vRefs, i, 1 );
}